

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O1

void idx2::Dealloc(brick_pool *Bp)

{
  allocator *paVar1;
  long lVar2;
  long lVar3;
  brick_volume *Vol;
  long lVar4;
  long lVar5;
  
  paVar1 = (Bp->ResolutionLevels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&Bp->ResolutionLevels);
  (Bp->ResolutionLevels).Size = 0;
  (Bp->ResolutionLevels).Capacity = 0;
  lVar2 = (Bp->BrickTable).LogCapacity;
  lVar4 = 1L << ((byte)lVar2 & 0x3f);
  lVar5 = lVar4;
  if (lVar2 != 0x3f) {
    lVar3 = 0;
    lVar2 = 0;
    if (0 < lVar4) {
      lVar2 = lVar4;
    }
    do {
      lVar5 = lVar3;
      if ((Bp->BrickTable).Stats[lVar3] == Occupied) break;
      lVar3 = lVar3 + 1;
      lVar5 = lVar4;
    } while (lVar2 + 1 != lVar3);
  }
  if (lVar5 != 1L << ((byte)(Bp->BrickTable).LogCapacity & 0x3f)) {
    Vol = (Bp->BrickTable).Vals + lVar5;
    do {
      Dealloc(&Vol->Vol);
      lVar2 = lVar5 * -0x40;
      do {
        lVar2 = lVar2 + -0x40;
        lVar4 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while ((Bp->BrickTable).Stats[lVar4] != Occupied);
      Vol = (brick_volume *)((long)(Bp->BrickTable).Vals - lVar2);
    } while (1L << ((byte)(Bp->BrickTable).LogCapacity & 0x3f) != lVar5);
  }
  Dealloc<unsigned_long,idx2::brick_volume>(&Bp->BrickTable);
  return;
}

Assistant:

void
Dealloc(brick_pool* Bp)
{
  Dealloc(&Bp->ResolutionLevels);
  idx2_ForEach (It, Bp->BrickTable)
    Dealloc(&It.Val->Vol);
  Dealloc(&Bp->BrickTable);
}